

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O2

AssemblyCommands * __thiscall
AssemblyCode::PatternMatcher::GenerateCode
          (AssemblyCommands *__return_storage_ptr__,PatternMatcher *this,
          CStatementList *cStatementList)

{
  pointer puVar1;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar2;
  int index;
  ulong uVar3;
  CTemp fakeDest;
  CTemp CStack_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = IRT::CStatementList::Statements(cStatementList);
  IRT::CTemp::CTemp(&CStack_48);
  for (uVar3 = 0;
      puVar1 = (pvVar2->
               super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(pvVar2->
                            super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar3 = uVar3 + 1) {
    GenerateCodeForNode(this,(INode *)puVar1[uVar3]._M_t.
                                      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                                      ._M_t,&CStack_48,__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&CStack_48);
  return __return_storage_ptr__;
}

Assistant:

AssemblyCommands AssemblyCode::PatternMatcher::GenerateCode( const IRT::CStatementList *cStatementList ) {
    AssemblyCommands commands;
    const std::vector<std::unique_ptr<const IRT::CStatement>> &statements = cStatementList->Statements( );
    IRT::CTemp fakeDest;
    for ( int index = 0; index < statements.size( ); ++index ) {
        GenerateCodeForNode( statements[ index ].get( ), fakeDest, commands );
    }
    return commands;
}